

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_random_with_add
              (void *p_rng,uchar *output,size_t output_len,uchar *additional,size_t add_len)

{
  char cVar1;
  int iVar2;
  uchar *local_b0;
  size_t use_len;
  uchar local_98 [4];
  int i;
  uchar tmp [16];
  uchar *local_80;
  uchar *p;
  uchar add_input [48];
  mbedtls_ctr_drbg_context *ctx;
  size_t sStack_38;
  int ret;
  size_t add_len_local;
  uchar *additional_local;
  size_t output_len_local;
  uchar *output_local;
  void *p_rng_local;
  
  if (output_len < 0x401) {
    if (add_len < 0x101) {
      add_input._40_8_ = p_rng;
      memset(&p,0,0x30);
      if ((*(int *)(add_input._40_8_ + 0x20) < *(int *)(add_input._40_8_ + 0x10)) ||
         (sStack_38 = add_len, *(int *)(add_input._40_8_ + 0x14) != 0)) {
        iVar2 = mbedtls_ctr_drbg_reseed
                          ((mbedtls_ctr_drbg_context *)add_input._40_8_,additional,add_len);
        if (iVar2 != 0) {
          return iVar2;
        }
        sStack_38 = 0;
      }
      local_80 = output;
      additional_local = (uchar *)output_len;
      if ((sStack_38 == 0) ||
         ((ctx._4_4_ = block_cipher_df((uchar *)&p,additional,sStack_38), ctx._4_4_ == 0 &&
          (ctx._4_4_ = ctr_drbg_update_internal
                                 ((mbedtls_ctr_drbg_context *)add_input._40_8_,(uchar *)&p),
          ctx._4_4_ == 0)))) {
        for (; additional_local != (uchar *)0x0;
            additional_local = additional_local + -(long)local_b0) {
          use_len._4_4_ = 0x10;
          while ((0 < use_len._4_4_ &&
                 (cVar1 = *(char *)(add_input._40_8_ + (long)(use_len._4_4_ + -1)) + '\x01',
                 *(char *)(add_input._40_8_ + (long)(use_len._4_4_ + -1)) = cVar1, cVar1 == '\0')))
          {
            use_len._4_4_ = use_len._4_4_ + -1;
          }
          ctx._4_4_ = mbedtls_aes_crypt_ecb
                                ((mbedtls_aes_context *)(add_input._40_8_ + 0x28),1,
                                 (uchar *)add_input._40_8_,local_98);
          if (ctx._4_4_ != 0) goto LAB_00139a57;
          if (additional_local < (uchar *)0x11) {
            local_b0 = additional_local;
          }
          else {
            local_b0 = (uchar *)0x10;
          }
          memcpy(local_80,local_98,(size_t)local_b0);
          local_80 = local_b0 + (long)local_80;
        }
        ctx._4_4_ = ctr_drbg_update_internal
                              ((mbedtls_ctr_drbg_context *)add_input._40_8_,(uchar *)&p);
        if (ctx._4_4_ == 0) {
          *(int *)(add_input._40_8_ + 0x10) = *(int *)(add_input._40_8_ + 0x10) + 1;
        }
      }
LAB_00139a57:
      mbedtls_platform_zeroize(&p,0x30);
      mbedtls_platform_zeroize(local_98,0x10);
      p_rng_local._4_4_ = ctx._4_4_;
    }
    else {
      p_rng_local._4_4_ = -0x38;
    }
  }
  else {
    p_rng_local._4_4_ = -0x36;
  }
  return p_rng_local._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_random_with_add( void *p_rng,
                              unsigned char *output, size_t output_len,
                              const unsigned char *additional, size_t add_len )
{
    int ret = 0;
    mbedtls_ctr_drbg_context *ctx = (mbedtls_ctr_drbg_context *) p_rng;
    unsigned char add_input[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = output;
    unsigned char tmp[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    int i;
    size_t use_len;

    if( output_len > MBEDTLS_CTR_DRBG_MAX_REQUEST )
        return( MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG );

    if( add_len > MBEDTLS_CTR_DRBG_MAX_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( add_input, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    if( ctx->reseed_counter > ctx->reseed_interval ||
        ctx->prediction_resistance )
    {
        if( ( ret = mbedtls_ctr_drbg_reseed( ctx, additional, add_len ) ) != 0 )
        {
            return( ret );
        }
        add_len = 0;
    }

    if( add_len > 0 )
    {
        if( ( ret = block_cipher_df( add_input, additional, add_len ) ) != 0 )
            goto exit;
        if( ( ret = ctr_drbg_update_internal( ctx, add_input ) ) != 0 )
            goto exit;
    }

    while( output_len > 0 )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        if( ( ret = mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT,
                                           ctx->counter, tmp ) ) != 0 )
        {
            goto exit;
        }

        use_len = ( output_len > MBEDTLS_CTR_DRBG_BLOCKSIZE )
            ? MBEDTLS_CTR_DRBG_BLOCKSIZE : output_len;
        /*
         * Copy random block to destination
         */
        memcpy( p, tmp, use_len );
        p += use_len;
        output_len -= use_len;
    }

    if( ( ret = ctr_drbg_update_internal( ctx, add_input ) ) != 0 )
        goto exit;

    ctx->reseed_counter++;

exit:
    mbedtls_platform_zeroize( add_input, sizeof( add_input ) );
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
    return( ret );
}